

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture2DView *src,float *texCoord,ReferenceParams *params)

{
  Sampler *sampler;
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  byte bVar7;
  bool bVar8;
  ulong uVar9;
  int i;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ConstPixelBufferAccess *levels;
  int iVar18;
  int iVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float s;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  Texture2DView TVar35;
  Vector<float,_4> res_1;
  Vec3 triS [2];
  Vec3 triW [2];
  Vec3 triT [2];
  IVec2 dstSize;
  Vec4 uq;
  Vector<float,_4> res;
  IVec2 srcSize;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  float triLod [2];
  Vec4 tq;
  Vec4 sq;
  Texture2DView view;
  float local_1a4;
  float local_198 [2];
  undefined8 uStack_190;
  int local_188;
  int local_184;
  Vec3 local_178;
  Vec3 local_16c;
  ConstPixelBufferAccess *local_160;
  undefined1 local_158 [32];
  Vec3 local_138;
  Vec3 local_12c;
  IVec2 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [8];
  ulong uStack_100;
  int local_f8 [2];
  undefined8 uStack_f0;
  undefined4 local_e8;
  int local_e4;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  IVec2 local_c8;
  undefined8 uStack_c0;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_b8;
  float local_98;
  uint uStack_94;
  undefined8 uStack_90;
  float local_80 [4];
  float local_70 [4];
  undefined1 local_60 [24];
  ConstPixelBufferAccess *local_48;
  IVec3 local_3c;
  
  iVar19 = params->baseLevel;
  iVar14 = src->m_numLevels + -1;
  iVar11 = iVar14;
  if (iVar19 < iVar14) {
    iVar11 = iVar19;
  }
  iVar18 = 0;
  if (-1 < iVar19) {
    iVar18 = iVar11;
  }
  iVar19 = params->maxLevel;
  if (iVar19 < iVar14) {
    iVar14 = iVar19;
  }
  local_60._16_4_ = 1;
  if (iVar18 <= iVar19) {
    local_60._16_4_ = (iVar14 - iVar18) + 1;
  }
  local_48 = src->m_levels + iVar18;
  fVar22 = *texCoord;
  fVar21 = texCoord[2];
  fVar34 = texCoord[4];
  fVar24 = texCoord[6];
  fVar29 = texCoord[1];
  fVar2 = texCoord[3];
  fVar3 = texCoord[5];
  fVar4 = texCoord[7];
  sampler = &params->sampler;
  local_80[0] = fVar29;
  local_80[1] = fVar2;
  local_80[2] = fVar3;
  local_80[3] = fVar4;
  local_70[0] = fVar22;
  local_70[1] = fVar21;
  local_70[2] = fVar34;
  local_70[3] = fVar24;
  if (((params->super_RenderParams).flags & 1) == 0) {
    local_b8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar35 = tcu::getEffectiveTextureView((Texture2DView *)(local_60 + 0x10),&local_b8,sampler);
    levels = TVar35.m_levels;
    uVar10 = TVar35.m_numLevels;
    fVar23 = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      fVar23 = (params->super_RenderParams).bias;
    }
    local_118.m_data[0] = dst->m_width;
    local_118.m_data[1] = dst->m_height;
    local_c8.m_data[1] = 0;
    local_c8.m_data[0] = 0;
    if (0 < (int)uVar10) {
      local_c8.m_data[0] = (levels->m_size).m_data[0];
      local_c8.m_data[1] = (levels->m_size).m_data[1];
    }
    local_178.m_data[0] = fVar22;
    local_178.m_data[1] = fVar21;
    local_178.m_data[2] = fVar34;
    local_16c.m_data[0] = fVar24;
    local_16c.m_data[1] = fVar34;
    local_16c.m_data[2] = fVar21;
    local_138.m_data[0] = fVar29;
    local_138.m_data[1] = fVar2;
    local_138.m_data[2] = fVar3;
    local_12c.m_data[0] = fVar4;
    local_12c.m_data[1] = fVar3;
    local_12c.m_data[2] = fVar2;
    fVar21 = computeNonProjectedTriLod(params->lodMode,&local_118,&local_c8,&local_178,&local_138);
    fVar21 = fVar21 + fVar23;
    fVar22 = params->maxLod;
    if (fVar21 <= params->maxLod) {
      fVar22 = fVar21;
    }
    uVar20 = -(uint)(fVar21 < params->minLod);
    _local_98 = CONCAT44(uStack_94,uVar20 & (uint)params->minLod | ~uVar20 & (uint)fVar22);
    fVar21 = computeNonProjectedTriLod(params->lodMode,&local_118,&local_c8,&local_16c,&local_12c);
    fVar21 = fVar21 + fVar23;
    fVar22 = params->maxLod;
    if (fVar21 <= params->maxLod) {
      fVar22 = fVar21;
    }
    uVar20 = -(uint)(fVar21 < params->minLod);
    _local_98 = CONCAT44(uVar20 & (uint)params->minLod | ~uVar20 & (uint)fVar22,local_98);
    if (0 < dst->m_height) {
      iVar19 = 0;
      do {
        iVar11 = dst->m_width;
        if (0 < iVar11) {
          iVar14 = 0;
          do {
            fVar22 = ((float)iVar19 + 0.5) / (float)dst->m_height;
            fVar21 = ((float)iVar14 + 0.5) / (float)iVar11;
            bVar8 = 1.0 <= fVar21 + fVar22;
            if (bVar8) {
              fVar21 = 1.0 - fVar21;
              fVar22 = 1.0 - fVar22;
            }
            fVar34 = (&local_178)[bVar8].m_data[0];
            fVar24 = ((&local_178)[bVar8].m_data[1] - fVar34) * fVar22 +
                     ((&local_16c)[(ulong)bVar8 - 1].m_data[2] - fVar34) * fVar21 + fVar34;
            fVar34 = (&local_138)[bVar8].m_data[0];
            fVar22 = ((&local_138)[bVar8].m_data[1] - fVar34) * fVar22 +
                     ((&local_12c)[(ulong)bVar8 - 1].m_data[2] - fVar34) * fVar21 + fVar34;
            if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
              local_108._0_4_ = 0;
              local_108._4_4_ = 0;
              uStack_100 = uStack_100 & 0xffffffff00000000;
              local_158._0_4_ =
                   tcu::sampleLevelArray2DCompare
                             (levels,uVar10,sampler,(params->super_RenderParams).ref,fVar24,fVar22,
                              (&local_98)[bVar8],(IVec3 *)local_108);
              local_158._4_4_ = SNORM_INT8;
              local_158._8_4_ = 0;
              local_158._12_4_ = 1.0;
            }
            else {
              tcu::sampleLevelArray2D
                        ((ConstPixelBufferAccess *)local_158,(int)TVar35.m_levels,
                         (Sampler *)(ulong)uVar10,fVar24,fVar22,(int)sampler,(&local_98)[bVar8]);
            }
            local_f8[0] = 0;
            local_f8[1] = 0;
            uStack_f0 = 0;
            lVar13 = 0;
            do {
              local_f8[lVar13] =
                   (int)(*(float *)(local_158 + lVar13 * 4) *
                        (params->super_RenderParams).colorScale.m_data[lVar13]);
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            local_198[0] = 0.0;
            local_198[1] = 0.0;
            uStack_190 = 0;
            lVar13 = 0;
            do {
              local_198[lVar13] =
                   (float)local_f8[lVar13] + (params->super_RenderParams).colorBias.m_data[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            bVar7 = dst->m_colorMask;
            uVar12 = 0;
            uVar20 = 0;
            if ((bVar7 & 1) != 0) {
              uVar15 = 0x7e - ((int)local_198[0] >> 0x17);
              uVar20 = (((uint)local_198[0] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)
                       ) + 0x800000;
              if (8 < uVar15) {
                uVar20 = uVar15;
              }
              uVar20 = uVar20 >> 0x18;
            }
            if ((bVar7 & 2) != 0) {
              uVar15 = 0x7e - ((int)local_198[1] >> 0x17);
              uVar12 = (((uint)local_198[1] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)
                       ) + 0x800000;
              if (8 < uVar15) {
                uVar12 = uVar15;
              }
              uVar12 = uVar12 >> 0x10 & 0xff00;
            }
            uVar15 = 0;
            if ((bVar7 & 4) != 0) {
              uVar16 = 0x7e - ((int)(uint)uStack_190 >> 0x17);
              uVar15 = (((uint)uStack_190 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar16 & 0x1f))
                       + 0x800000;
              if (8 < uVar16) {
                uVar15 = uVar16;
              }
              uVar15 = uVar15 >> 8 & 0xff0000;
            }
            uVar16 = 0xff000000;
            if ((bVar7 & 8) != 0) {
              uVar17 = 0x7e - ((int)uStack_190._4_4_ >> 0x17);
              uVar16 = ((uStack_190._4_4_ & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar17 & 0x1f))
                       + 0x800000;
              if (8 < uVar17) {
                uVar16 = uVar17;
              }
              uVar16 = uVar16 & 0xff000000;
            }
            *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                     (long)((dst->m_y + iVar19) * dst->m_surface->m_width + dst->m_x + iVar14) * 4)
                 = uVar12 | uVar20 | uVar15 | uVar16;
            iVar14 = iVar14 + 1;
            iVar11 = dst->m_width;
          } while (iVar14 < iVar11);
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 < dst->m_height);
    }
  }
  else {
    local_b8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar35 = tcu::getEffectiveTextureView((Texture2DView *)(local_60 + 0x10),&local_b8,sampler);
    local_160 = TVar35.m_levels;
    uVar10 = TVar35.m_numLevels;
    fVar23 = 0.0;
    local_1a4 = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      local_1a4 = (params->super_RenderParams).bias;
    }
    iVar19 = dst->m_height;
    if (0 < (int)uVar10) {
      fVar23 = (float)(local_160->m_size).m_data[0];
    }
    iVar11 = dst->m_width;
    local_dc = (float)iVar19;
    local_108._0_4_ = 0;
    local_108._4_4_ = 0;
    uStack_100 = 0;
    lVar13 = 0;
    do {
      *(float *)(local_108 + lVar13 * 4) = local_70[lVar13] * fVar23;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    if ((int)uVar10 < 1) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = (float)(local_160->m_size).m_data[1];
    }
    local_118.m_data[0] = 0;
    local_118.m_data[1] = 0;
    uStack_110 = 0;
    lVar13 = 0;
    do {
      local_118.m_data[lVar13] = (int)(local_80[lVar13] * fVar23);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    local_178.m_data[0] = fVar22;
    local_178.m_data[1] = fVar21;
    local_178.m_data[2] = fVar34;
    local_16c.m_data[0] = fVar24;
    local_16c.m_data[1] = fVar34;
    local_16c.m_data[2] = fVar21;
    local_138.m_data[0] = fVar29;
    local_138.m_data[1] = fVar2;
    local_138.m_data[2] = fVar3;
    local_12c.m_data[0] = fVar4;
    local_12c.m_data[1] = fVar3;
    local_12c.m_data[2] = fVar2;
    local_184 = local_108._4_4_;
    local_198[0] = (float)local_108._0_4_;
    local_198[1] = (float)local_108._4_4_;
    uStack_190 = uStack_100;
    local_188 = (int)uStack_100;
    local_e4 = local_118.m_data[1];
    local_f8[0] = local_118.m_data[0];
    local_f8[1] = local_118.m_data[1];
    uStack_f0 = uStack_110;
    local_e8 = (undefined4)uStack_110;
    pfVar1 = (params->super_RenderParams).w.m_data + 1;
    local_158._0_4_ = (params->super_RenderParams).w.m_data[0];
    local_158._4_8_ = *(undefined8 *)pfVar1;
    local_158._12_4_ = (params->super_RenderParams).w.m_data[3];
    local_158._16_4_ = (params->super_RenderParams).w.m_data[2];
    local_158._20_4_ = *pfVar1;
    if (0 < iVar19) {
      iVar19 = 0;
      do {
        iVar14 = dst->m_width;
        if (0 < iVar14) {
          local_d0 = (float)iVar19 + 0.5;
          fVar22 = local_d0 / local_dc;
          local_d4 = local_dc - local_d0;
          local_d8 = 1.0 - fVar22;
          iVar18 = 0;
          do {
            fVar24 = (float)iVar18 + 0.5;
            fVar29 = fVar24 / (float)iVar11;
            bVar8 = 1.0 <= fVar22 + fVar29;
            fVar21 = fVar22;
            fVar34 = local_d0;
            if (bVar8) {
              fVar24 = (float)iVar11 - fVar24;
              fVar29 = 1.0 - fVar29;
              fVar21 = local_d8;
              fVar34 = local_d4;
            }
            uVar9 = (ulong)bVar8;
            lVar13 = uVar9 * 0xc;
            fVar23 = (1.0 - fVar29) - fVar21;
            fVar2 = *(float *)(local_158 + lVar13);
            fVar3 = *(float *)(local_158 + lVar13 + 4);
            fVar4 = *(float *)(local_158 + lVar13 + 8);
            fVar26 = fVar29 / fVar4 + fVar21 / fVar3 + fVar23 / fVar2;
            s = (((&local_16c)[uVar9 - 1].m_data[2] * fVar29) / fVar4 +
                ((&local_178)[uVar9].m_data[1] * fVar21) / fVar3 +
                ((&local_178)[uVar9].m_data[0] * fVar23) / fVar2) / fVar26;
            fVar31 = (float)iVar14;
            fVar25 = (float)dst->m_height;
            fVar26 = ((fVar29 * (&local_12c)[uVar9 - 1].m_data[2]) / fVar4 +
                     (fVar21 * (&local_138)[uVar9].m_data[1]) / fVar3 +
                     (fVar23 * (&local_138)[uVar9].m_data[0]) / fVar2) / fVar26;
            fVar27 = fVar34 / fVar25;
            fVar21 = *(float *)((long)&uStack_190 + lVar13);
            fVar29 = local_198[uVar9 * 3];
            fVar23 = local_198[uVar9 * 3 + 1];
            local_cc = (float)local_f8[uVar9 * 3];
            fVar5 = (float)local_f8[uVar9 * 3 + 1];
            fVar6 = *(float *)((long)&uStack_f0 + lVar13);
            fVar33 = fVar27 + -1.0;
            fVar30 = fVar24 / fVar31;
            fVar28 = fVar30 + -1.0;
            fVar32 = (fVar31 * fVar33 + fVar24) * fVar3 * fVar4 -
                     (fVar4 * fVar31 * fVar27 + fVar3 * fVar24) * fVar2;
            fVar24 = fVar2 * fVar3 * fVar4;
            fVar31 = fVar24 * fVar31;
            fVar32 = fVar32 * fVar32;
            fVar34 = (fVar25 * fVar28 + fVar34) * fVar3 * fVar4 -
                     (fVar3 * fVar25 * fVar30 + fVar34 * fVar4) * fVar2;
            fVar24 = fVar24 * fVar25;
            fVar34 = fVar34 * fVar34;
            fVar21 = computeLodFromDerivates
                               (params->lodMode,
                                (((fVar29 - fVar21) * fVar3 * fVar33 +
                                 ((fVar23 - fVar29) * fVar4 + (fVar21 - fVar23) * fVar2) * fVar27) *
                                fVar31) / fVar32,
                                (((local_cc - fVar6) * fVar3 * fVar33 +
                                 ((fVar5 - local_cc) * fVar4 + (fVar6 - fVar5) * fVar2) * fVar27) *
                                fVar31) / fVar32,
                                (((fVar29 - fVar23) * fVar4 * fVar28 +
                                 ((fVar23 - fVar21) * fVar2 + (fVar21 - fVar29) * fVar3) * fVar30) *
                                fVar24) / fVar34,
                                (((local_cc - fVar5) * fVar4 * fVar28 +
                                 ((fVar5 - fVar6) * fVar2 + (fVar6 - local_cc) * fVar3) * fVar30) *
                                fVar24) / fVar34);
            if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
              local_3c.m_data[0] = 0;
              local_3c.m_data[1] = 0;
              local_3c.m_data[2] = 0;
              local_60._0_4_ =
                   tcu::sampleLevelArray2DCompare
                             (local_160,uVar10,sampler,(params->super_RenderParams).ref,s,fVar26,
                              fVar21 + local_1a4,&local_3c);
              local_60._4_4_ = SNORM_INT8;
              local_60._8_4_ = 0;
              local_60._12_4_ = 0x3f800000;
            }
            else {
              tcu::sampleLevelArray2D
                        ((ConstPixelBufferAccess *)local_60,(int)local_160,(Sampler *)(ulong)uVar10,
                         s,fVar26,(int)sampler,fVar21 + local_1a4);
            }
            _local_98 = 0;
            uStack_90 = 0;
            lVar13 = 0;
            do {
              (&local_98)[lVar13] =
                   *(float *)(local_60 + lVar13 * 4) *
                   (params->super_RenderParams).colorScale.m_data[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            local_c8.m_data[0] = 0;
            local_c8.m_data[1] = 0;
            uStack_c0 = 0;
            lVar13 = 0;
            do {
              local_c8.m_data[lVar13] =
                   (int)((&local_98)[lVar13] + (params->super_RenderParams).colorBias.m_data[lVar13]
                        );
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            bVar7 = dst->m_colorMask;
            uVar12 = 0;
            uVar20 = 0;
            if ((bVar7 & 1) != 0) {
              uVar15 = 0x7e - (local_c8.m_data[0] >> 0x17);
              uVar20 = ((local_c8.m_data[0] & 0x7fffffU) * 0xff + 0x7f800000 >>
                       ((byte)uVar15 & 0x1f)) + 0x800000;
              if (8 < uVar15) {
                uVar20 = uVar15;
              }
              uVar20 = uVar20 >> 0x18;
            }
            if ((bVar7 & 2) != 0) {
              uVar15 = 0x7e - (local_c8.m_data[1] >> 0x17);
              uVar12 = ((local_c8.m_data[1] & 0x7fffffU) * 0xff + 0x7f800000 >>
                       ((byte)uVar15 & 0x1f)) + 0x800000;
              if (8 < uVar15) {
                uVar12 = uVar15;
              }
              uVar12 = uVar12 >> 0x10 & 0xff00;
            }
            uVar15 = 0;
            if ((bVar7 & 4) != 0) {
              uVar16 = 0x7e - ((int)(uint)uStack_c0 >> 0x17);
              uVar15 = (((uint)uStack_c0 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar16 & 0x1f)) +
                       0x800000;
              if (8 < uVar16) {
                uVar15 = uVar16;
              }
              uVar15 = uVar15 >> 8 & 0xff0000;
            }
            uVar16 = 0xff000000;
            if ((bVar7 & 8) != 0) {
              uVar17 = 0x7e - ((int)uStack_c0._4_4_ >> 0x17);
              uVar16 = ((uStack_c0._4_4_ & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar17 & 0x1f)) +
                       0x800000;
              if (8 < uVar17) {
                uVar16 = uVar17;
              }
              uVar16 = uVar16 & 0xff000000;
            }
            *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                     (long)((dst->m_y + iVar19) * dst->m_surface->m_width + dst->m_x + iVar18) * 4)
                 = uVar12 | uVar20 | uVar15 | uVar16;
            iVar18 = iVar18 + 1;
            iVar14 = dst->m_width;
          } while (iVar18 < iVar14);
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 < dst->m_height);
    }
  }
  if (local_b8.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture2DView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::Texture2DView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4				tq		= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	if (params.flags & ReferenceParams::PROJECTED)
		sampleTextureProjected(dst, view, sq, tq, params);
	else
		sampleTextureNonProjected(dst, view, sq, tq, params);
}